

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

pseudo_t symbol_pseudo(dmr_C *C,entrypoint *ep,symbol *sym)

{
  pseudo_t ptr;
  
  if (sym == (symbol *)0x0) {
    ptr = &C->L->void_pseudo;
  }
  else {
    ptr = sym->pseudo;
    if (ptr == (pseudo_t)0x0) {
      ptr = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator,0);
      ptr->nr = -1;
      ptr->type = PSEUDO_SYM;
      (ptr->field_5).sym = sym;
      ptr->ident = sym->ident;
      sym->pseudo = ptr;
      ptrlist_add((ptr_list **)&ep->accesses,ptr,&C->ptrlist_allocator);
    }
  }
  return ptr;
}

Assistant:

static pseudo_t symbol_pseudo(struct dmr_C *C, struct entrypoint *ep, struct symbol *sym)
{
	pseudo_t pseudo;

	if (!sym)
		return VOID_PSEUDO(C);

	pseudo = sym->pseudo;
	if (!pseudo) {
		pseudo = (pseudo_t)dmrC_allocator_allocate(&C->L->pseudo_allocator, 0);
		pseudo->nr = -1;
		pseudo->type = PSEUDO_SYM;
		pseudo->sym = sym;
		pseudo->ident = sym->ident;
		sym->pseudo = pseudo;
		dmrC_add_pseudo(C, &ep->accesses, pseudo);
	}
	/* Symbol pseudos have neither nr, usage nor def */
	return pseudo;
}